

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O3

size_t ZSTD_ldm_generateSequences
                 (ldmState_t *ldmState,rawSeqStore_t *sequences,ldmParams_t *params,void *src,
                 size_t srcSize)

{
  BYTE **ppBVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong *puVar5;
  U32 *pUVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  U32 UVar9;
  uint uVar10;
  uint uVar11;
  ldmEntry_t *plVar12;
  U64 UVar13;
  size_t sVar14;
  rawSeq *prVar15;
  bool bVar16;
  ldmParams_t ldmParams;
  ldmParams_t ldmParams_00;
  ldmParams_t ldmParams_01;
  BYTE *pBVar17;
  long lVar18;
  U32 newLowLimit;
  uint uVar19;
  uint uVar20;
  U32 UVar21;
  ulong uVar22;
  ulong *puVar23;
  ulong uVar24;
  ulong *puVar25;
  ulong uVar26;
  uint uVar27;
  ulong *puVar28;
  ulong *puVar29;
  uint uVar30;
  ulong *puVar31;
  ulong uVar32;
  ldmEntry_t *plVar33;
  ulong uVar34;
  ulong rollingHash;
  U32 hBits;
  ulong uVar35;
  ulong uVar36;
  ulong *puVar37;
  U32 UVar38;
  ulong *puVar39;
  BYTE *pBVar40;
  uint uVar41;
  uint uVar42;
  ulong *puVar43;
  ulong uVar44;
  ulong uVar45;
  int iVar46;
  BYTE *istart;
  ulong *puVar47;
  long lVar48;
  long lVar49;
  ulong *puVar50;
  ulong *puVar51;
  U32 UVar52;
  long lVar53;
  undefined1 in_stack_fffffffffffffe48 [12];
  uint uVar54;
  BYTE *local_198;
  ulong *local_190;
  void *local_158;
  ulong local_130;
  long local_c8;
  ulong local_c0;
  ldmEntry_t *local_b8;
  
  uVar41 = 1 << ((byte)params->windowLog & 0x1f);
  lVar53 = (ulong)((srcSize & 0xfffff) != 0) + (srcSize >> 0x14);
  if (lVar53 != 0) {
    lVar48 = 0;
    uVar22 = 0;
    uVar34 = sequences->size;
    local_158 = src;
    do {
      if (sequences->capacity <= uVar34) {
        return 0;
      }
      puVar2 = (ulong *)((long)src + lVar48 * 0x100000);
      puVar23 = puVar2 + 0x20000;
      if (srcSize + lVar48 * -0x100000 < 0x100000) {
        puVar23 = (ulong *)((long)src + srcSize);
      }
      local_198 = (ldmState->window).base;
      uVar19 = (int)puVar23 - (int)local_198;
      if (0xe0000000 < uVar19) {
        UVar9 = params->hashLog;
        uVar19 = ((int)src - (int)local_198) - uVar41;
        local_198 = local_198 + uVar19;
        (ldmState->window).base = local_198;
        ppBVar1 = &(ldmState->window).dictBase;
        *ppBVar1 = *ppBVar1 + uVar19;
        uVar7 = (ldmState->window).dictLimit;
        uVar8 = (ldmState->window).lowLimit;
        (ldmState->window).dictLimit = uVar7 - uVar19;
        (ldmState->window).lowLimit = uVar8 - uVar19;
        plVar12 = ldmState->hashTable;
        lVar49 = 0;
        do {
          uVar27 = plVar12[lVar49].offset;
          UVar38 = uVar27 - uVar19;
          if (uVar27 < uVar19) {
            UVar38 = 0;
          }
          plVar12[lVar49].offset = UVar38;
          lVar49 = lVar49 + 1;
        } while (1L << ((byte)UVar9 & 0x3f) != lVar49);
        uVar19 = (int)puVar23 - (int)local_198;
      }
      uVar27 = (ldmState->window).lowLimit;
      uVar20 = uVar19 - uVar41;
      if (uVar19 < uVar41 || uVar20 == 0) {
        uVar19 = (ldmState->window).dictLimit;
      }
      else {
        if (uVar27 < uVar20) {
          (ldmState->window).lowLimit = uVar20;
          uVar27 = uVar20;
        }
        uVar19 = (ldmState->window).dictLimit;
        if (uVar19 < uVar27) {
          (ldmState->window).dictLimit = uVar27;
          uVar19 = uVar27;
        }
      }
      UVar9 = params->bucketSizeLog;
      uVar20 = params->hashRateLog;
      UVar38 = params->hashLog;
      uVar10 = params->minMatchLength;
      uVar24 = (ulong)uVar10;
      UVar13 = ldmState->hashPower;
      if (uVar27 < uVar19) {
        pBVar40 = (ldmState->window).dictBase;
        uVar42 = uVar27;
      }
      else {
        pBVar40 = (BYTE *)0x0;
        uVar42 = uVar19;
      }
      uVar35 = (long)puVar23 - (long)puVar2;
      puVar43 = (ulong *)(pBVar40 + uVar42);
      if (uVar19 <= uVar27) {
        puVar43 = (ulong *)0x0;
      }
      puVar3 = (ulong *)((long)puVar2 + uVar35);
      uVar26 = 8;
      if (8 < uVar10) {
        uVar26 = uVar24;
      }
      puVar39 = (ulong *)((long)puVar3 - uVar26);
      uVar26 = uVar35;
      if (puVar2 <= puVar39) {
        hBits = UVar38 - UVar9;
        uVar26 = (ulong)uVar19;
        puVar4 = (ulong *)(local_198 + uVar26);
        uVar30 = 0x20 - hBits;
        puVar5 = (ulong *)((long)puVar3 - 7);
        puVar31 = (ulong *)(ulong)(uVar30 - uVar20);
        if (uVar30 < uVar20) {
          puVar31 = (ulong *)0x0;
        }
        puVar25 = (ulong *)0x0;
        rollingHash = 0;
        puVar47 = puVar2;
        uVar54 = uVar27;
        local_190 = puVar2;
        do {
          if (puVar47 == puVar2) {
            if (uVar10 == 0) {
              rollingHash = 0;
            }
            else {
              uVar32 = 0;
              rollingHash = 0;
              do {
                rollingHash = rollingHash * -0x30e44323485a9b9d +
                              (ulong)*(byte *)((long)local_158 + uVar32) + 10;
                uVar32 = uVar32 + 1;
              } while (uVar24 != uVar32);
            }
          }
          else {
            rollingHash = (rollingHash - ((ulong)(byte)*puVar25 + 10) * UVar13) *
                          -0x30e44323485a9b9d + (ulong)*(byte *)((long)puVar25 + uVar24) + 10;
          }
          puVar25 = puVar47;
          if (((uint)(rollingHash >> ((byte)puVar31 & 0x3f)) | -1 << ((byte)uVar20 & 0x1f)) ==
              0xffffffff) {
            iVar46 = (int)puVar47;
            UVar21 = iVar46 - (int)local_198;
            uVar32 = rollingHash >> (0x40U - (char)hBits & 0x3f) & 0xffffffff;
            if (UVar38 == UVar9) {
              uVar32 = 0;
            }
            plVar33 = ldmState->hashTable + (uVar32 << ((byte)params->bucketSizeLog & 0x3f));
            plVar12 = plVar33 + (1L << ((byte)UVar9 & 0x3f));
            local_c0 = 0;
            local_c8 = 0;
            local_b8 = (ldmEntry_t *)0x0;
            local_130 = 0;
            do {
              if (plVar33->checksum == (U32)(rollingHash >> ((byte)uVar30 & 0x3f))) {
                uVar11 = plVar33->offset;
                uVar32 = (ulong)uVar11;
                if (uVar42 < uVar11) {
                  if (uVar27 < uVar19) {
                    puVar29 = puVar3;
                    pBVar17 = local_198;
                    if (uVar11 < uVar19) {
                      puVar29 = (ulong *)(pBVar40 + uVar26);
                      pBVar17 = pBVar40;
                    }
                    puVar37 = (ulong *)(pBVar17 + uVar32);
                    puVar28 = (ulong *)(((long)puVar29 - (long)puVar37) + (long)puVar47);
                    if (puVar23 <= puVar28) {
                      puVar28 = puVar3;
                    }
                    puVar51 = puVar47;
                    puVar50 = puVar37;
                    if (puVar47 < (ulong *)((long)puVar28 - 7U)) {
                      if (*puVar37 == *puVar47) {
                        lVar49 = 0;
                        do {
                          puVar51 = (ulong *)((long)puVar47 + lVar49 + 8);
                          if ((ulong *)((long)puVar28 - 7U) <= puVar51) {
                            puVar50 = (ulong *)(pBVar17 + lVar49 + uVar32 + 8);
                            goto LAB_0046814d;
                          }
                          lVar18 = lVar49 + uVar32 + 8;
                          lVar49 = lVar49 + 8;
                        } while (*(ulong *)(pBVar17 + lVar18) == *puVar51);
                        uVar44 = *puVar51 ^ *(ulong *)(pBVar17 + lVar18);
                        uVar45 = 0;
                        if (uVar44 != 0) {
                          for (; (uVar44 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                          }
                        }
                        uVar45 = (uVar45 >> 3 & 0x1fffffff) + lVar49;
                      }
                      else {
                        uVar44 = *puVar47 ^ *puVar37;
                        uVar45 = 0;
                        if (uVar44 != 0) {
                          for (; (uVar44 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                          }
                        }
                        uVar45 = uVar45 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_0046814d:
                      if ((puVar51 < (ulong *)((long)puVar28 - 3U)) &&
                         ((int)*puVar50 == (int)*puVar51)) {
                        puVar51 = (ulong *)((long)puVar51 + 4);
                        puVar50 = (ulong *)((long)puVar50 + 4);
                      }
                      if ((puVar51 < (ulong *)((long)puVar28 - 1U)) &&
                         ((short)*puVar50 == (short)*puVar51)) {
                        puVar51 = (ulong *)((long)puVar51 + 2);
                        puVar50 = (ulong *)((long)puVar50 + 2);
                      }
                      if (puVar51 < puVar28) {
                        puVar51 = (ulong *)((long)puVar51 +
                                           (ulong)((byte)*puVar50 == (byte)*puVar51));
                      }
                      uVar45 = (long)puVar51 - (long)puVar47;
                    }
                    if ((ulong *)((long)puVar37 + uVar45) == puVar29) {
                      puVar29 = (ulong *)(uVar45 + (long)puVar47);
                      puVar28 = puVar29;
                      puVar51 = puVar4;
                      if (puVar29 < puVar5) {
                        if (*puVar4 == *puVar29) {
                          lVar49 = 0;
                          do {
                            puVar28 = (ulong *)((long)puVar47 + lVar49 + uVar45 + 8);
                            if (puVar5 <= puVar28) {
                              puVar51 = (ulong *)(local_198 + lVar49 + uVar26 + 8);
                              goto LAB_00468322;
                            }
                            lVar18 = lVar49 + uVar26 + 8;
                            lVar49 = lVar49 + 8;
                          } while (*(ulong *)(local_198 + lVar18) == *puVar28);
                          uVar36 = *puVar28 ^ *(ulong *)(local_198 + lVar18);
                          uVar44 = 0;
                          if (uVar36 != 0) {
                            for (; (uVar36 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                            }
                          }
                          uVar44 = (uVar44 >> 3 & 0x1fffffff) + lVar49;
                        }
                        else {
                          uVar36 = *puVar29 ^ *puVar4;
                          uVar44 = 0;
                          if (uVar36 != 0) {
                            for (; (uVar36 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                            }
                          }
                          uVar44 = uVar44 >> 3 & 0x1fffffff;
                        }
                      }
                      else {
LAB_00468322:
                        if ((puVar28 < (ulong *)((long)puVar3 - 3U)) &&
                           ((int)*puVar51 == (int)*puVar28)) {
                          puVar28 = (ulong *)((long)puVar28 + 4);
                          puVar51 = (ulong *)((long)puVar51 + 4);
                        }
                        if ((puVar28 < (ulong *)((long)puVar3 - 1U)) &&
                           ((short)*puVar51 == (short)*puVar28)) {
                          puVar28 = (ulong *)((long)puVar28 + 2);
                          puVar51 = (ulong *)((long)puVar51 + 2);
                        }
                        if (puVar28 < puVar23) {
                          puVar28 = (ulong *)((long)puVar28 +
                                             (ulong)((byte)*puVar51 == (byte)*puVar28));
                        }
                        uVar44 = (long)puVar28 - (long)puVar29;
                      }
                      uVar45 = uVar45 + uVar44;
                    }
                    uVar27 = uVar54;
                    if (uVar24 <= uVar45) {
                      puVar29 = puVar4;
                      if (uVar11 < uVar19) {
                        puVar29 = puVar43;
                      }
                      if ((local_190 < puVar47) && (puVar29 < puVar37)) {
                        puVar37 = (ulong *)(pBVar17 + uVar32);
                        lVar49 = 0;
                        puVar28 = (ulong *)((long)puVar47 + -1);
                        do {
                          puVar37 = (ulong *)((long)puVar37 + -1);
                          if (((byte)*puVar28 != *(byte *)puVar37) ||
                             (lVar49 = lVar49 + 1, puVar28 <= local_190)) break;
                          puVar28 = (ulong *)((long)puVar28 + -1);
                        } while (puVar29 < puVar37);
                        uVar32 = lVar49 + uVar45;
                      }
                      else {
                        lVar49 = 0;
                        uVar32 = uVar45;
                      }
LAB_0046840e:
                      if (local_130 < uVar32) {
                        local_130 = uVar32;
                        local_c8 = lVar49;
                        local_c0 = uVar45;
                        local_b8 = plVar33;
                      }
                    }
                  }
                  else {
                    puVar29 = (ulong *)(local_198 + uVar32);
                    puVar37 = puVar47;
                    if (puVar47 < puVar5) {
                      if (*puVar29 == *puVar47) {
                        lVar49 = 0;
                        do {
                          puVar37 = (ulong *)((long)puVar47 + lVar49 + 8);
                          if (puVar5 <= puVar37) {
                            puVar29 = (ulong *)(local_198 + lVar49 + uVar32 + 8);
                            goto LAB_00468249;
                          }
                          lVar18 = lVar49 + uVar32 + 8;
                          lVar49 = lVar49 + 8;
                        } while (*(ulong *)(local_198 + lVar18) == *puVar37);
                        uVar44 = *puVar37 ^ *(ulong *)(local_198 + lVar18);
                        uVar45 = 0;
                        if (uVar44 != 0) {
                          for (; (uVar44 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                          }
                        }
                        uVar45 = (uVar45 >> 3 & 0x1fffffff) + lVar49;
                      }
                      else {
                        uVar44 = *puVar47 ^ *puVar29;
                        uVar45 = 0;
                        if (uVar44 != 0) {
                          for (; (uVar44 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                          }
                        }
                        uVar45 = uVar45 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_00468249:
                      if ((puVar37 < (ulong *)((long)puVar3 - 3U)) &&
                         ((int)*puVar29 == (int)*puVar37)) {
                        puVar37 = (ulong *)((long)puVar37 + 4);
                        puVar29 = (ulong *)((long)puVar29 + 4);
                      }
                      if ((puVar37 < (ulong *)((long)puVar3 - 1U)) &&
                         ((short)*puVar29 == (short)*puVar37)) {
                        puVar37 = (ulong *)((long)puVar37 + 2);
                        puVar29 = (ulong *)((long)puVar29 + 2);
                      }
                      if (puVar37 < puVar23) {
                        puVar37 = (ulong *)((long)puVar37 +
                                           (ulong)((byte)*puVar29 == (byte)*puVar37));
                      }
                      uVar45 = (long)puVar37 - (long)puVar47;
                    }
                    if (uVar24 <= uVar45) {
                      if ((local_190 < puVar47) && (uVar19 < uVar11)) {
                        lVar49 = 0;
                        puVar29 = (ulong *)((long)puVar47 + -1);
                        puVar37 = (ulong *)(local_198 + (uVar32 - 1));
                        do {
                          if (((byte)*puVar29 != (byte)*puVar37) ||
                             (lVar49 = lVar49 + 1, puVar29 <= local_190)) break;
                          puVar29 = (ulong *)((long)puVar29 + -1);
                          bVar16 = puVar4 < puVar37;
                          puVar37 = (ulong *)((long)puVar37 + -1);
                        } while (bVar16);
                        uVar32 = lVar49 + uVar45;
                      }
                      else {
                        lVar49 = 0;
                        uVar32 = uVar45;
                      }
                      goto LAB_0046840e;
                    }
                  }
                }
              }
              plVar33 = plVar33 + 1;
            } while (plVar33 < plVar12);
            if (local_b8 == (ldmEntry_t *)0x0) {
              ldmParams_00.minMatchLength = uVar42;
              ldmParams_00.enableLdm = in_stack_fffffffffffffe48._0_4_;
              ldmParams_00.hashLog = in_stack_fffffffffffffe48._4_4_;
              ldmParams_00.bucketSizeLog = in_stack_fffffffffffffe48._8_4_;
              ldmParams_00.hashRateLog = uVar54;
              ldmParams_00.windowLog = uVar19;
              uVar27 = uVar54;
              ZSTD_ldm_makeEntryAndInsertByTag(ldmState,rollingHash,hBits,UVar21,ldmParams_00);
              puVar29 = (ulong *)((long)puVar47 + 1);
              uVar54 = uVar27;
            }
            else {
              sVar14 = sequences->size;
              if (sVar14 == sequences->capacity) {
                return 0xffffffffffffffba;
              }
              prVar15 = sequences->seq;
              UVar52 = local_b8->offset;
              prVar15[sVar14].litLength = (iVar46 - (int)local_c8) - (int)local_190;
              prVar15[sVar14].matchLength = (int)local_c8 + (int)local_c0;
              prVar15[sVar14].offset = UVar21 - UVar52;
              sequences->size = sVar14 + 1;
              ldmParams.minMatchLength = uVar42;
              ldmParams.enableLdm = in_stack_fffffffffffffe48._0_4_;
              ldmParams.hashLog = in_stack_fffffffffffffe48._4_4_;
              ldmParams.bucketSizeLog = in_stack_fffffffffffffe48._8_4_;
              ldmParams.hashRateLog = uVar54;
              ldmParams.windowLog = uVar19;
              ZSTD_ldm_makeEntryAndInsertByTag(ldmState,rollingHash,hBits,UVar21,ldmParams);
              local_190 = (ulong *)(local_c0 + (long)puVar47);
              puVar29 = local_190;
              if (local_190 <= puVar39) {
                uVar27 = uVar54;
                if (1 < (long)local_c0) {
                  UVar21 = params->minMatchLength;
                  lVar49 = local_c0 - 1;
                  UVar52 = (1 - (int)local_198) + iVar46;
                  do {
                    rollingHash = (rollingHash - ((ulong)(byte)*puVar47 + 10) * ldmState->hashPower)
                                  * -0x30e44323485a9b9d +
                                  (ulong)*(byte *)((long)puVar47 + (ulong)(UVar21 - 1) + 1) + 10;
                    ldmParams_01.minMatchLength = uVar42;
                    ldmParams_01.enableLdm = in_stack_fffffffffffffe48._0_4_;
                    ldmParams_01.hashLog = in_stack_fffffffffffffe48._4_4_;
                    ldmParams_01.bucketSizeLog = in_stack_fffffffffffffe48._8_4_;
                    ldmParams_01.hashRateLog = uVar54;
                    ldmParams_01.windowLog = uVar19;
                    ZSTD_ldm_makeEntryAndInsertByTag(ldmState,rollingHash,hBits,UVar52,ldmParams_01)
                    ;
                    puVar47 = (ulong *)((long)puVar47 + 1);
                    UVar52 = UVar52 + 1;
                    lVar49 = lVar49 + -1;
                    uVar27 = uVar54;
                  } while (lVar49 != 0);
                }
                puVar25 = (ulong *)((long)local_190 - 1);
                uVar54 = uVar27;
              }
            }
          }
          else {
            puVar29 = (ulong *)((long)puVar47 + 1);
          }
          puVar47 = puVar29;
        } while (puVar47 <= puVar39);
        uVar26 = (long)puVar23 - (long)local_190;
      }
      if (0xffffffffffffff88 < uVar26) {
        return uVar26;
      }
      uVar24 = sequences->size;
      if (uVar34 < uVar24) {
        pUVar6 = &sequences->seq[uVar34].litLength;
        *pUVar6 = *pUVar6 + (int)uVar22;
      }
      else {
        uVar26 = uVar35 + uVar22;
      }
      lVar48 = lVar48 + 1;
      local_158 = (void *)((long)local_158 + 0x100000);
      uVar22 = uVar26;
      uVar34 = uVar24;
    } while (lVar48 != lVar53);
  }
  return 0;
}

Assistant:

size_t ZSTD_ldm_generateSequences(
        ldmState_t* ldmState, rawSeqStore_t* sequences,
        ldmParams_t const* params, void const* src, size_t srcSize)
{
    U32 const maxDist = 1U << params->windowLog;
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    size_t const kMaxChunkSize = 1 << 20;
    size_t const nbChunks = (srcSize / kMaxChunkSize) + ((srcSize % kMaxChunkSize) != 0);
    size_t chunk;
    size_t leftoverSize = 0;

    assert(ZSTD_CHUNKSIZE_MAX >= kMaxChunkSize);
    /* Check that ZSTD_window_update() has been called for this chunk prior
     * to passing it to this function.
     */
    assert(ldmState->window.nextSrc >= (BYTE const*)src + srcSize);
    /* The input could be very large (in zstdmt), so it must be broken up into
     * chunks to enforce the maximmum distance and handle overflow correction.
     */
    assert(sequences->pos <= sequences->size);
    assert(sequences->size <= sequences->capacity);
    for (chunk = 0; chunk < nbChunks && sequences->size < sequences->capacity; ++chunk) {
        BYTE const* const chunkStart = istart + chunk * kMaxChunkSize;
        size_t const remaining = (size_t)(iend - chunkStart);
        BYTE const *const chunkEnd =
            (remaining < kMaxChunkSize) ? iend : chunkStart + kMaxChunkSize;
        size_t const chunkSize = chunkEnd - chunkStart;
        size_t newLeftoverSize;
        size_t const prevSize = sequences->size;

        assert(chunkStart < iend);
        /* 1. Perform overflow correction if necessary. */
        if (ZSTD_window_needOverflowCorrection(ldmState->window, chunkEnd)) {
            U32 const ldmHSize = 1U << params->hashLog;
            U32 const correction = ZSTD_window_correctOverflow(
                &ldmState->window, /* cycleLog */ 0, maxDist, src);
            ZSTD_ldm_reduceTable(ldmState->hashTable, ldmHSize, correction);
        }
        /* 2. We enforce the maximum offset allowed.
         *
         * kMaxChunkSize should be small enough that we don't lose too much of
         * the window through early invalidation.
         * TODO: * Test the chunk size.
         *       * Try invalidation after the sequence generation and test the
         *         the offset against maxDist directly.
         */
        ZSTD_window_enforceMaxDist(&ldmState->window, chunkEnd, maxDist, NULL, NULL);
        /* 3. Generate the sequences for the chunk, and get newLeftoverSize. */
        newLeftoverSize = ZSTD_ldm_generateSequences_internal(
            ldmState, sequences, params, chunkStart, chunkSize);
        if (ZSTD_isError(newLeftoverSize))
            return newLeftoverSize;
        /* 4. We add the leftover literals from previous iterations to the first
         *    newly generated sequence, or add the `newLeftoverSize` if none are
         *    generated.
         */
        /* Prepend the leftover literals from the last call */
        if (prevSize < sequences->size) {
            sequences->seq[prevSize].litLength += (U32)leftoverSize;
            leftoverSize = newLeftoverSize;
        } else {
            assert(newLeftoverSize == chunkSize);
            leftoverSize += chunkSize;
        }
    }
    return 0;
}